

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O3

void ZSTD_rescaleFreqs(optState_t *optPtr,BYTE *src,size_t srcSize,int optLevel)

{
  uint *puVar1;
  short sVar2;
  uint *puVar3;
  ZSTD_entropyCTables_t *pZVar4;
  undefined1 auVar5 [16];
  undefined8 in_RAX;
  long lVar6;
  U32 UVar7;
  long lVar8;
  uint lit;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  uint uVar14;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  undefined1 auVar15 [16];
  undefined1 auVar19 [16];
  uint lit_1;
  undefined8 uStack_28;
  
  optPtr->priceType = zop_dynamic;
  uStack_28 = in_RAX;
  if (optPtr->litLengthSum == 0) {
    if (srcSize < 0x401) {
      optPtr->priceType = zop_predef;
    }
    if ((optPtr->symbolCosts->huf).repeatMode == HUF_repeat_valid) {
      lVar6 = 0;
      optPtr->priceType = zop_dynamic;
      optPtr->litSum = 0;
      do {
        UVar7 = HUF_getNbBits(optPtr->symbolCosts,(U32)lVar6);
        uVar14 = 1 << (0xbU - (char)UVar7 & 0x1f);
        if (UVar7 == 0) {
          uVar14 = 1;
        }
        optPtr->litFreq[lVar6] = uVar14;
        optPtr->litSum = optPtr->litSum + uVar14;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x100);
      puVar3 = optPtr->litLengthFreq;
      pZVar4 = optPtr->symbolCosts;
      sVar2 = (short)(pZVar4->fse).litlengthCTable[0];
      lVar6 = 1;
      if (sVar2 != 0) {
        lVar6 = (long)(1 << ((char)sVar2 - 1U & 0x1f));
      }
      optPtr->litLengthSum = 0;
      lVar8 = 0;
      do {
        uVar14 = (pZVar4->fse).litlengthCTable[lVar6 + lVar8 * 2 + 2] + 0xffff;
        uVar16 = 1 << (10U - (char)(uVar14 >> 0x10) & 0x1f);
        if (uVar14 < 0x10000) {
          uVar16 = 1;
        }
        puVar3[lVar8] = uVar16;
        optPtr->litLengthSum = optPtr->litLengthSum + uVar16;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x24);
      sVar2 = (short)(pZVar4->fse).matchlengthCTable[0];
      lVar6 = 1;
      if (sVar2 != 0) {
        lVar6 = (long)(1 << ((char)sVar2 - 1U & 0x1f));
      }
      optPtr->matchLengthSum = 0;
      puVar3 = optPtr->matchLengthFreq;
      lVar8 = 0;
      do {
        uVar14 = (pZVar4->fse).matchlengthCTable[lVar6 + lVar8 * 2 + 2] + 0xffff;
        uVar16 = 1 << (10U - (char)(uVar14 >> 0x10) & 0x1f);
        if (uVar14 < 0x10000) {
          uVar16 = 1;
        }
        puVar3[lVar8] = uVar16;
        optPtr->matchLengthSum = optPtr->matchLengthSum + uVar16;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x35);
      sVar2 = (short)(pZVar4->fse).offcodeCTable[0];
      lVar6 = 1;
      if (sVar2 != 0) {
        lVar6 = (long)(1 << ((char)sVar2 - 1U & 0x1f));
      }
      optPtr->offCodeSum = 0;
      puVar3 = optPtr->offCodeFreq;
      lVar8 = 0;
      do {
        uVar14 = (pZVar4->fse).offcodeCTable[lVar6 + lVar8 * 2 + 2] + 0xffff;
        uVar16 = 1 << (10U - (char)(uVar14 >> 0x10) & 0x1f);
        if (uVar14 < 0x10000) {
          uVar16 = 1;
        }
        puVar3[lVar8] = uVar16;
        optPtr->offCodeSum = optPtr->offCodeSum + uVar16;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x20);
      goto LAB_0048781e;
    }
    uStack_28 = CONCAT44(0xff,(int)in_RAX);
    HIST_count_simple(optPtr->litFreq,(uint *)((long)&uStack_28 + 4),src,srcSize);
    puVar3 = optPtr->litFreq;
    iVar9 = 0;
    iVar10 = 0;
    iVar11 = 0;
    iVar12 = 0;
    lVar6 = 0;
    do {
      puVar1 = puVar3 + lVar6;
      uVar14 = (*puVar1 >> 5) + 1;
      uVar16 = (puVar1[1] >> 5) + 1;
      uVar17 = (puVar1[2] >> 5) + 1;
      uVar18 = (puVar1[3] >> 5) + 1;
      puVar1 = puVar3 + lVar6;
      *puVar1 = uVar14;
      puVar1[1] = uVar16;
      puVar1[2] = uVar17;
      puVar1[3] = uVar18;
      iVar9 = iVar9 + uVar14;
      iVar10 = iVar10 + uVar16;
      iVar11 = iVar11 + uVar17;
      iVar12 = iVar12 + uVar18;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x100);
    optPtr->litSum = iVar12 + iVar10 + iVar11 + iVar9;
    puVar3 = optPtr->litLengthFreq;
    lVar6 = 0;
    do {
      puVar1 = puVar3 + lVar6;
      puVar1[0] = 1;
      puVar1[1] = 1;
      puVar1[2] = 1;
      puVar1[3] = 1;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x24);
    optPtr->litLengthSum = 0x24;
    auVar5 = _DAT_00526580;
    puVar3 = optPtr->matchLengthFreq;
    lVar6 = 3;
    auVar13 = _DAT_00526560;
    auVar15 = _DAT_00526570;
    do {
      auVar19 = auVar15 ^ auVar5;
      if (auVar19._4_4_ == -0x80000000 && auVar19._0_4_ < -0x7fffffcb) {
        puVar3[lVar6 + -3] = 1;
        puVar3[lVar6 + -2] = 1;
      }
      auVar19 = auVar13 ^ auVar5;
      if (auVar19._4_4_ == -0x80000000 && auVar19._0_4_ < -0x7fffffcb) {
        puVar3[lVar6 + -1] = 1;
        puVar3[lVar6] = 1;
      }
      lVar8 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 4;
      auVar15._8_8_ = lVar8 + 4;
      lVar8 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 4;
      auVar13._8_8_ = lVar8 + 4;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x3b);
    optPtr->matchLengthSum = 0x35;
    puVar3 = optPtr->offCodeFreq;
    lVar6 = 0;
    do {
      puVar1 = puVar3 + lVar6;
      puVar1[0] = 1;
      puVar1[1] = 1;
      puVar1[2] = 1;
      puVar1[3] = 1;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x20);
    UVar7 = 0x20;
  }
  else {
    puVar3 = optPtr->litFreq;
    iVar9 = 0;
    iVar10 = 0;
    iVar11 = 0;
    iVar12 = 0;
    lVar6 = 0;
    do {
      puVar1 = puVar3 + lVar6;
      uVar14 = (*puVar1 >> 5) + 1;
      uVar16 = (puVar1[1] >> 5) + 1;
      uVar17 = (puVar1[2] >> 5) + 1;
      uVar18 = (puVar1[3] >> 5) + 1;
      puVar1 = puVar3 + lVar6;
      *puVar1 = uVar14;
      puVar1[1] = uVar16;
      puVar1[2] = uVar17;
      puVar1[3] = uVar18;
      iVar9 = iVar9 + uVar14;
      iVar10 = iVar10 + uVar16;
      iVar11 = iVar11 + uVar17;
      iVar12 = iVar12 + uVar18;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x100);
    optPtr->litSum = iVar12 + iVar10 + iVar11 + iVar9;
    puVar3 = optPtr->litLengthFreq;
    iVar9 = 0;
    iVar10 = 0;
    iVar11 = 0;
    iVar12 = 0;
    lVar6 = 0;
    do {
      puVar1 = puVar3 + lVar6;
      uVar14 = (*puVar1 >> 4) + 1;
      uVar16 = (puVar1[1] >> 4) + 1;
      uVar17 = (puVar1[2] >> 4) + 1;
      uVar18 = (puVar1[3] >> 4) + 1;
      puVar1 = puVar3 + lVar6;
      *puVar1 = uVar14;
      puVar1[1] = uVar16;
      puVar1[2] = uVar17;
      puVar1[3] = uVar18;
      iVar9 = iVar9 + uVar14;
      iVar10 = iVar10 + uVar16;
      iVar11 = iVar11 + uVar17;
      iVar12 = iVar12 + uVar18;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x24);
    optPtr->litLengthSum = iVar12 + iVar10 + iVar11 + iVar9;
    puVar3 = optPtr->matchLengthFreq;
    lVar6 = 0;
    UVar7 = 0;
    do {
      uVar14 = puVar3[lVar6] >> 4;
      puVar3[lVar6] = uVar14 + 1;
      UVar7 = UVar7 + uVar14 + 1;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x35);
    optPtr->matchLengthSum = UVar7;
    puVar3 = optPtr->offCodeFreq;
    iVar9 = 0;
    iVar10 = 0;
    iVar11 = 0;
    iVar12 = 0;
    lVar6 = 0;
    do {
      puVar1 = puVar3 + lVar6;
      uVar14 = (*puVar1 >> 4) + 1;
      uVar16 = (puVar1[1] >> 4) + 1;
      uVar17 = (puVar1[2] >> 4) + 1;
      uVar18 = (puVar1[3] >> 4) + 1;
      puVar1 = puVar3 + lVar6;
      *puVar1 = uVar14;
      puVar1[1] = uVar16;
      puVar1[2] = uVar17;
      puVar1[3] = uVar18;
      iVar9 = iVar9 + uVar14;
      iVar10 = iVar10 + uVar16;
      iVar11 = iVar11 + uVar17;
      iVar12 = iVar12 + uVar18;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x20);
    UVar7 = iVar12 + iVar10 + iVar11 + iVar9;
  }
  optPtr->offCodeSum = UVar7;
LAB_0048781e:
  ZSTD_setBasePrices(optPtr,optLevel);
  return;
}

Assistant:

static void
ZSTD_rescaleFreqs(optState_t* const optPtr,
            const BYTE* const src, size_t const srcSize,
                  int const optLevel)
{
    DEBUGLOG(5, "ZSTD_rescaleFreqs (srcSize=%u)", (unsigned)srcSize);
    optPtr->priceType = zop_dynamic;

    if (optPtr->litLengthSum == 0) {  /* first block : init */
        if (srcSize <= ZSTD_PREDEF_THRESHOLD) {  /* heuristic */
            DEBUGLOG(5, "(srcSize <= ZSTD_PREDEF_THRESHOLD) => zop_predef");
            optPtr->priceType = zop_predef;
        }

        assert(optPtr->symbolCosts != NULL);
        if (optPtr->symbolCosts->huf.repeatMode == HUF_repeat_valid) {
            /* huffman table presumed generated by dictionary */
            optPtr->priceType = zop_dynamic;

            assert(optPtr->litFreq != NULL);
            optPtr->litSum = 0;
            {   unsigned lit;
                for (lit=0; lit<=MaxLit; lit++) {
                    U32 const scaleLog = 11;   /* scale to 2K */
                    U32 const bitCost = HUF_getNbBits(optPtr->symbolCosts->huf.CTable, lit);
                    assert(bitCost <= scaleLog);
                    optPtr->litFreq[lit] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litSum += optPtr->litFreq[lit];
            }   }

            {   unsigned ll;
                FSE_CState_t llstate;
                FSE_initCState(&llstate, optPtr->symbolCosts->fse.litlengthCTable);
                optPtr->litLengthSum = 0;
                for (ll=0; ll<=MaxLL; ll++) {
                    U32 const scaleLog = 10;   /* scale to 1K */
                    U32 const bitCost = FSE_getMaxNbBits(llstate.symbolTT, ll);
                    assert(bitCost < scaleLog);
                    optPtr->litLengthFreq[ll] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litLengthSum += optPtr->litLengthFreq[ll];
            }   }

            {   unsigned ml;
                FSE_CState_t mlstate;
                FSE_initCState(&mlstate, optPtr->symbolCosts->fse.matchlengthCTable);
                optPtr->matchLengthSum = 0;
                for (ml=0; ml<=MaxML; ml++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(mlstate.symbolTT, ml);
                    assert(bitCost < scaleLog);
                    optPtr->matchLengthFreq[ml] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->matchLengthSum += optPtr->matchLengthFreq[ml];
            }   }

            {   unsigned of;
                FSE_CState_t ofstate;
                FSE_initCState(&ofstate, optPtr->symbolCosts->fse.offcodeCTable);
                optPtr->offCodeSum = 0;
                for (of=0; of<=MaxOff; of++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(ofstate.symbolTT, of);
                    assert(bitCost < scaleLog);
                    optPtr->offCodeFreq[of] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->offCodeSum += optPtr->offCodeFreq[of];
            }   }

        } else {  /* not a dictionary */

            assert(optPtr->litFreq != NULL);
            {   unsigned lit = MaxLit;
                HIST_count_simple(optPtr->litFreq, &lit, src, srcSize);   /* use raw first block to init statistics */
            }
            optPtr->litSum = ZSTD_downscaleStat(optPtr->litFreq, MaxLit, 1);

            {   unsigned ll;
                for (ll=0; ll<=MaxLL; ll++)
                    optPtr->litLengthFreq[ll] = 1;
            }
            optPtr->litLengthSum = MaxLL+1;

            {   unsigned ml;
                for (ml=0; ml<=MaxML; ml++)
                    optPtr->matchLengthFreq[ml] = 1;
            }
            optPtr->matchLengthSum = MaxML+1;

            {   unsigned of;
                for (of=0; of<=MaxOff; of++)
                    optPtr->offCodeFreq[of] = 1;
            }
            optPtr->offCodeSum = MaxOff+1;

        }

    } else {   /* new block : re-use previous statistics, scaled down */

        optPtr->litSum = ZSTD_downscaleStat(optPtr->litFreq, MaxLit, 1);
        optPtr->litLengthSum = ZSTD_downscaleStat(optPtr->litLengthFreq, MaxLL, 0);
        optPtr->matchLengthSum = ZSTD_downscaleStat(optPtr->matchLengthFreq, MaxML, 0);
        optPtr->offCodeSum = ZSTD_downscaleStat(optPtr->offCodeFreq, MaxOff, 0);
    }

    ZSTD_setBasePrices(optPtr, optLevel);
}